

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_PlaneEquation *
ON_PlaneEquation::CreateFromThreePoints(ON_3dPoint pointA,ON_3dPoint pointB,ON_3dPoint pointC)

{
  ON_3dPoint point;
  ON_3dVector normal;
  double dVar1;
  double dVar2;
  double dVar3;
  ON_PlaneEquation *in_RDI;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dVector local_68;
  double in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  
  dVar3 = NanPlaneEquation.d;
  dVar2 = NanPlaneEquation.y;
  dVar1 = NanPlaneEquation.x;
  if ((((((ABS(in_stack_00000008) < 1.23432101234321e+308) &&
         (ABS(in_stack_00000010) < 1.23432101234321e+308)) &&
        (ABS(in_stack_00000018) < 1.23432101234321e+308)) &&
       ((ABS(in_stack_00000020) < 1.23432101234321e+308 &&
        (ABS(in_stack_00000028) < 1.23432101234321e+308)))) &&
      ((ABS(in_stack_00000030) < 1.23432101234321e+308 &&
       ((ABS(in_stack_00000038) < 1.23432101234321e+308 &&
        (ABS(in_stack_00000040) < 1.23432101234321e+308)))))) &&
     (ABS(in_stack_00000048) < 1.23432101234321e+308)) {
    ON_3dVector::ON_3dVector
              ((ON_3dVector *)&stack0xffffffffffffffc8,in_stack_00000020 - in_stack_00000008,
               in_stack_00000028 - in_stack_00000010,in_stack_00000030 - in_stack_00000018);
    ON_3dVector::ON_3dVector
              ((ON_3dVector *)&stack0xffffffffffffffb0,in_stack_00000038 - in_stack_00000008,
               in_stack_00000040 - in_stack_00000010,in_stack_00000048 - in_stack_00000018);
    ON_3dVector::ON_3dVector
              (&local_68,
               in_stack_ffffffffffffffd0 * in_stack_ffffffffffffffc0 -
               in_stack_ffffffffffffffd8 * in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffd8 * in_stack_ffffffffffffffb0 -
               in_stack_ffffffffffffffc0 * in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc8 * in_stack_ffffffffffffffb8 -
               in_stack_ffffffffffffffd0 * in_stack_ffffffffffffffb0);
    point.y = in_stack_ffffffffffffffb8;
    point.x = in_stack_ffffffffffffffb0;
    point.z = in_stack_ffffffffffffffc0;
    normal.y = in_stack_ffffffffffffffd0;
    normal.x = in_stack_ffffffffffffffc8;
    normal.z = in_stack_ffffffffffffffd8;
    CreateFromPointAndNormal(point,normal);
    return in_RDI;
  }
  in_RDI->z = NanPlaneEquation.z;
  in_RDI->d = dVar3;
  in_RDI->x = dVar1;
  in_RDI->y = dVar2;
  return in_RDI;
}

Assistant:

const ON_PlaneEquation ON_PlaneEquation::CreateFromThreePoints(
  ON_3dPoint pointA,
  ON_3dPoint pointB,
  ON_3dPoint pointC
)
{
  if (pointA.IsValid() && pointB.IsValid() && pointC.IsValid())
  {
    const ON_3dVector X = pointB - pointA;
    const ON_3dVector Y = pointC - pointA;
    return ON_PlaneEquation::CreateFromPointAndNormal(pointA, ON_3dVector::CrossProduct(X, Y));
  }
  return ON_PlaneEquation::NanPlaneEquation;
}